

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt * __thiscall slang::SVInt::operator|=(SVInt *this,SVInt *rhs)

{
  ulong *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  
  uVar9 = (this->super_SVIntStorage).bitWidth;
  uVar7 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar9 != uVar7) {
    bVar6 = (rhs->super_SVIntStorage).signFlag & (this->super_SVIntStorage).signFlag;
    if (uVar9 < uVar7) {
      if (bVar6 == 0) {
        zext((SVInt *)&local_38,(bitwidth_t)this);
      }
      else {
        sext((SVInt *)&local_38,(bitwidth_t)this);
      }
      operator=(this,(SVInt *)&local_38);
      if (((0x40 < local_30) || (paVar8 = &local_38, (local_2b & 1) != 0)) &&
         (paVar8 = &local_38, (void *)local_38.val != (void *)0x0)) {
        operator_delete__(local_38.pVal);
        paVar8 = &local_38;
      }
    }
    else {
      if (bVar6 == 0) {
        zext((SVInt *)&local_38,(bitwidth_t)rhs);
      }
      else {
        sext((SVInt *)&local_38,(bitwidth_t)rhs);
      }
      paVar8 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)operator|=(this,(SVInt *)&local_38);
      if (((0x40 < local_30) || ((local_2b & 1) != 0)) && ((void *)local_38.val != (void *)0x0)) {
        operator_delete__(local_38.pVal);
      }
    }
    if (uVar7 <= uVar9) {
      return (SVInt *)paVar8;
    }
  }
  if (((this->super_SVIntStorage).unknownFlag == false) &&
     ((rhs->super_SVIntStorage).unknownFlag == true)) {
    makeUnknown(this);
  }
  uVar9 = (this->super_SVIntStorage).bitWidth;
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  if (uVar9 < 0x41 && (bVar2 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.val =
         (this->super_SVIntStorage).field_0.val | (rhs->super_SVIntStorage).field_0.val;
  }
  else {
    uVar9 = uVar9 + 0x3f;
    uVar7 = uVar9 >> 6;
    if ((bVar2 & 1U) == 0) {
      if (0x3f < uVar9) {
        uVar10 = 0;
        do {
          puVar1 = (this->super_SVIntStorage).field_0.pVal + uVar10;
          *puVar1 = *puVar1 | (rhs->super_SVIntStorage).field_0.pVal[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
    }
    else {
      bVar2 = (rhs->super_SVIntStorage).unknownFlag;
      if ((rhs->super_SVIntStorage).bitWidth < 0x41 && (bVar2 & 1U) == 0) {
        puVar1 = (ulong *)((this->super_SVIntStorage).field_0.val + 8);
        *puVar1 = *puVar1 & ~(rhs->super_SVIntStorage).field_0.val;
        puVar1 = (this->super_SVIntStorage).field_0.pVal;
        *puVar1 = ((rhs->super_SVIntStorage).field_0.val | *puVar1) & ~puVar1[1];
      }
      else {
        if ((bVar2 & 1U) == 0) {
          if (0x3f < uVar9) {
            uVar10 = 0;
            do {
              puVar1 = (ulong *)((long)(this->super_SVIntStorage).field_0.pVal + uVar10 + uVar7 * 8)
              ;
              *puVar1 = *puVar1 & ~*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar10)
              ;
              uVar10 = uVar10 + 8;
            } while (uVar7 * 8 != uVar10);
          }
        }
        else if (0x3f < uVar9) {
          uVar10 = (ulong)(uVar7 * 8);
          uVar11 = 0;
          do {
            puVar3 = (this->super_SVIntStorage).field_0.pVal;
            puVar4 = (rhs->super_SVIntStorage).field_0.pVal;
            uVar5 = *(ulong *)((long)puVar4 + uVar10 + uVar11);
            *(ulong *)((long)puVar3 + uVar10 + uVar11) =
                 ~*(ulong *)((long)puVar3 + uVar11) & uVar5 |
                 (~*(ulong *)((long)puVar4 + uVar11) | uVar5) &
                 *(ulong *)((long)puVar3 + uVar10 + uVar11);
            uVar11 = uVar11 + 8;
          } while (uVar10 != uVar11);
        }
        if (0x3f < uVar9) {
          uVar10 = 0;
          do {
            puVar3 = (this->super_SVIntStorage).field_0.pVal;
            *(ulong *)((long)puVar3 + uVar10) =
                 (*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar10) |
                 *(ulong *)((long)puVar3 + uVar10)) &
                 ~*(ulong *)((long)puVar3 + (uVar7 << 3) + uVar10);
            uVar10 = uVar10 + 8;
          } while (uVar7 << 3 != uVar10);
        }
      }
    }
  }
  clearUnusedBits(this);
  checkUnknown(this);
  return this;
}

Assistant:

SVInt& SVInt::operator|=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this |= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val |= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord()) {
                pVal[1] &= ~rhs.val;
                pVal[0] = ~pVal[1] & (pVal[0] | rhs.val);
            }
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++) {
                        pVal[i + words] = (pVal[i + words] & (rhs.pVal[i + words] | ~rhs.pVal[i])) |
                                          (~pVal[i] & rhs.pVal[i + words]);
                    }
                }
                else {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] &= ~rhs.pVal[i];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] | rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] |= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    checkUnknown();
    return *this;
}